

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void testing::internal::TuplePrefix<8ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int,int,int,int,int,int,int>>
               (tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                *matchers,tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *values,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  _Head_base<7UL,_int,_false> *x;
  StringMatchResultListener listener;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  MatcherBase<int> local_1d8;
  MatchResultListener local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  TuplePrefix<7ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int,int,int,int,int,int,int>>
            (matchers,values,os);
  local_1d8.vtable_ =
       *(VTable **)
        ((long)&(matchers->
                super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                ).
                super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                .
                super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                .
                super__Tuple_impl<3UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                .
                super__Tuple_impl<4UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                .
                super__Tuple_impl<5UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                .
                super__Tuple_impl<6UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
        + 0x20);
  local_1d8.buffer_ =
       (Buffer)((Buffer *)
               ((long)&(matchers->
                       super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       ).
                       super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<3UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<4UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<5UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<6UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
               + 0x28))->shared;
  if ((local_1d8.vtable_ != (VTable *)0x0) &&
     ((local_1d8.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_1d8.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_1d8.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00190378;
  local_1c0.stream_ = local_1a0;
  local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00190418;
  std::__cxx11::stringstream::stringstream(local_1b0);
  x = (_Head_base<7UL,_int,_false> *)
      ((long)&(values->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
              super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
              super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
              super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
              super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.
              super__Tuple_impl<5UL,_int,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int,_int> + 4);
  bVar1 = MatcherBase<int>::MatchAndExplain(&local_1d8,(int *)x,&local_1c0);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    MatcherBase<int>::DescribeTo
              ((MatcherBase<int> *)
               ((long)&(matchers->
                       super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       ).
                       super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<3UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<4UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<5UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                       .
                       super__Tuple_impl<6UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
               + 0x18),os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    std::ostream::operator<<((ostream *)os,x->_M_head_impl);
    std::__cxx11::stringbuf::str();
    iVar2 = std::__cxx11::string::compare((char *)&local_1f8);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1f8,local_1f0);
    }
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00190418;
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  MatcherBase<int>::~MatcherBase(&local_1d8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }